

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O3

void __thiscall helics::CoreBroker::CoreBroker(CoreBroker *this,bool setAsRootBroker)

{
  _Rb_tree_header *p_Var1;
  TimeoutMonitor *pTVar2;
  condition_variable *this_00;
  long lVar3;
  
  (this->super_Broker)._vptr_Broker = (_func_int **)&PTR__Broker_00527268;
  BrokerBase::BrokerBase(&this->super_BrokerBase,false);
  (this->super_Broker)._vptr_Broker = (_func_int **)&PTR__CoreBroker_00526fb8;
  (this->super_BrokerBase)._vptr_BrokerBase = (_func_int **)&PTR__CoreBroker_00527108;
  (this->super_BrokerBase).field_0x292 = 0;
  (this->super_BrokerBase).field_0x293 = setAsRootBroker;
  (this->super_BrokerBase).field_0x294 = setAsRootBroker;
  *(undefined2 *)&(this->super_BrokerBase).field_0x295 = 0;
  this->routeCount = 1;
  (this->mFederates).dataStorage.
  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mFederates).dataStorage.
  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mFederates).dataStorage.
  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mFederates).lookup1._M_h._M_buckets = &(this->mFederates).lookup1._M_h._M_single_bucket;
  (this->mFederates).lookup1._M_h._M_bucket_count = 1;
  (this->mFederates).lookup1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mFederates).lookup1._M_h._M_element_count = 0;
  (this->mFederates).lookup1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mFederates).lookup1._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mFederates).lookup1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mFederates).names.csize = 0;
  (this->mFederates).names.dataptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->mFederates).names.dataSlotsAvailable = 0;
  (this->mFederates).names.dataSlotIndex = 0;
  (this->mFederates).names.bsize = 0x20;
  (this->mFederates).names.freeSlotsAvailable = 0;
  (this->mFederates).names.freeIndex = 0;
  (this->mFederates).names.freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->mFederates).lookup2._M_h._M_buckets = &(this->mFederates).lookup2._M_h._M_single_bucket;
  (this->mFederates).lookup2._M_h._M_bucket_count = 1;
  (this->mFederates).lookup2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mFederates).lookup2._M_h._M_element_count = 0;
  (this->mFederates).lookup2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mBrokers).dataStorage.
  super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mBrokers).dataStorage.
  super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mBrokers).dataStorage.
  super__Vector_base<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mFederates).lookup2._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mFederates).lookup2._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mBrokers).lookup1._M_h._M_buckets = &(this->mBrokers).lookup1._M_h._M_single_bucket;
  (this->mBrokers).lookup1._M_h._M_bucket_count = 1;
  (this->mBrokers).lookup1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mBrokers).lookup1._M_h._M_element_count = 0;
  (this->mBrokers).lookup1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mBrokers).lookup1._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mBrokers).lookup1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mBrokers).names.csize = 0;
  (this->mBrokers).names.dataptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->mBrokers).names.dataSlotsAvailable = 0;
  (this->mBrokers).names.dataSlotIndex = 0;
  (this->mBrokers).names.bsize = 0x20;
  (this->mBrokers).names.freeSlotsAvailable = 0;
  (this->mBrokers).names.freeIndex = 0;
  (this->mBrokers).names.freeblocks =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
  (this->mBrokers).lookup2._M_h._M_buckets = &(this->mBrokers).lookup2._M_h._M_single_bucket;
  (this->mBrokers).lookup2._M_h._M_bucket_count = 1;
  (this->mBrokers).lookup2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mBrokers).lookup2._M_h._M_element_count = 0;
  (this->mBrokers).lookup2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mBrokers).lookup2._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mBrokers).lookup2._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mPreviousLocalBrokerIdentifier)._M_dataplus._M_p =
       (pointer)&(this->mPreviousLocalBrokerIdentifier).field_2;
  (this->mPreviousLocalBrokerIdentifier)._M_string_length = 0;
  (this->mPreviousLocalBrokerIdentifier).field_2._M_local_buf[0] = '\0';
  HandleManager::HandleManager(&this->handles);
  UnknownHandleManager::UnknownHandleManager(&this->unknownHandles);
  (this->delayedDependencies).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->delayedDependencies).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delayedDependencies).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::GlobalFederateId>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->global_id_translation)._M_h._M_buckets =
       &(this->global_id_translation)._M_h._M_single_bucket;
  (this->global_id_translation)._M_h._M_bucket_count = 1;
  (this->global_id_translation)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->global_id_translation)._M_h._M_element_count = 0;
  (this->global_id_translation)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->global_id_translation)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->global_id_translation)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->routing_table)._M_h._M_buckets = &(this->routing_table)._M_h._M_single_bucket;
  (this->routing_table)._M_h._M_bucket_count = 1;
  (this->routing_table)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->routing_table)._M_h._M_element_count = 0;
  (this->routing_table)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->routing_table)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->routing_table)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->knownExternalEndpoints)._M_h._M_buckets =
       &(this->knownExternalEndpoints)._M_h._M_single_bucket;
  (this->knownExternalEndpoints)._M_h._M_bucket_count = 1;
  (this->knownExternalEndpoints)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->knownExternalEndpoints)._M_h._M_element_count = 0;
  (this->knownExternalEndpoints)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->knownExternalEndpoints)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->knownExternalEndpoints)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->global_values)._M_h._M_buckets = &(this->global_values)._M_h._M_single_bucket;
  (this->global_values)._M_h._M_bucket_count = 1;
  (this->global_values)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->global_values)._M_h._M_element_count = 0;
  (this->global_values)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->global_values)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->global_values)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->renamers)._M_h._M_buckets = &(this->renamers)._M_h._M_single_bucket;
  (this->renamers)._M_h._M_bucket_count = 1;
  (this->renamers)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->renamers)._M_h._M_element_count = 0;
  (this->renamers)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->name_mutex_).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->name_mutex_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->name_mutex_).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->name_mutex_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->name_mutex_).super___mutex_base._M_mutex + 8) = 0;
  (this->renamers)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->renamers)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->queryCounter).super___atomic_base<int>._M_i = 1;
  this->force_connection = false;
  p_Var1 = &(this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->activeQueries).promiseByInteger._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->activeQueries).promiseByString._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->activeQueries).promiseLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->activeQueries).promiseLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->activeQueries).promiseLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->activeQueries).promiseLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->activeQueries).promiseLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->activeQueries).usedPromiseByInteger._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->queryTimeouts).
  super__Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->activeQueries).usedPromiseByString._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mapBuilders).
  super__Vector_base<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>,_std::allocator<std::tuple<helics::fileops::JsonMapBuilder,_std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_helics::QueryReuse>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  _Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>,_std::allocator<std::pair<int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>_>
                       *)&this->queryTimeouts,0);
  *(undefined8 *)((long)&(this->disconnection).activeLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->disconnection).activeLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->disconnection).activeLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->disconnection).activeLock.super___mutex_base._M_mutex + 8) = 0;
  (this->disconnection).activeLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->earlyMessages).
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->earlyMessages).
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->earlyMessages).
           super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
           .super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->earlyMessages).
           super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl
           .super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->disconnection).triggerLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->disconnection).triggerLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->disconnection).triggerLock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->disconnection).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  *(undefined8 *)
   ((long)&(this->disconnection).triggerLock.super___mutex_base._M_mutex.__data.__list.__prev + 1) =
       0;
  *(undefined8 *)
   ((long)&(this->disconnection).triggerLock.super___mutex_base._M_mutex.__data.__list.__next + 1) =
       0;
  std::condition_variable::condition_variable(&(this->disconnection).cv_trigger);
  std::condition_variable::condition_variable(&(this->disconnection).cv_active);
  pTVar2 = (TimeoutMonitor *)operator_new(0x40);
  (pTVar2->timeout).__r = 0;
  *(undefined8 *)&pTVar2->waitingForConnection = 0;
  (pTVar2->startWaiting).__d.__r = 0;
  (pTVar2->parentConnection).waitingForPingReply = false;
  (pTVar2->parentConnection).activeConnection = false;
  (pTVar2->parentConnection).disablePing = false;
  (pTVar2->parentConnection).field_0x3 = 0;
  (pTVar2->parentConnection).connection = 0;
  (pTVar2->timeout).__r = 100000000;
  *(undefined4 *)((long)&(pTVar2->startWaiting).__d + 7) = 0;
  (pTVar2->startWaiting).__d.__r = 0;
  *(undefined8 *)
   ((long)&(pTVar2->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_> + 4)
       = 0;
  *(undefined8 *)
   ((long)&(pTVar2->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_> + 0xc
   ) = 0;
  *(undefined4 *)
   ((long)&(pTVar2->connections).
           super__Vector_base<helics::linkConnection,_std::allocator<helics::linkConnection>_> +
   0x14) = 0;
  *(undefined8 *)&(pTVar2->parentConnection).connection = 0;
  *(undefined8 *)((long)&(pTVar2->parentConnection).lastPing + 4) = 0;
  (this->timeoutMon)._M_t.
  super___uniq_ptr_impl<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>._M_t.
  super__Tuple_impl<0UL,_helics::TimeoutMonitor_*,_std::default_delete<helics::TimeoutMonitor>_>.
  super__Head_base<0UL,_helics::TimeoutMonitor_*,_false>._M_head_impl = pTVar2;
  (this->nextAirLock).super___atomic_base<unsigned_short>._M_i = 0;
  this_00 = &(this->dataAirlocks)._M_elems[0].condition;
  lVar3 = 0x150;
  do {
    this_00[-0x40] = (condition_variable)0x0;
    *(undefined8 *)(this_00 + -0x38) = 0;
    *(undefined8 *)(this_00 + -0x30) = 0;
    *(undefined8 *)(this_00 + -0x28) = 0;
    *(undefined8 *)(this_00 + -0x20) = 0;
    *(undefined8 *)(this_00 + -0x18) = 0;
    *(undefined8 *)(this_00 + -0x10) = 0;
    *(undefined8 *)(this_00 + -8) = 0;
    std::condition_variable::condition_variable(this_00);
    this_00 = this_00 + 0x70;
    lVar3 = lVar3 + -0x70;
  } while (lVar3 != 0);
  (this->mTimeMonitorFederate)._M_dataplus._M_p = (pointer)&(this->mTimeMonitorFederate).field_2;
  (this->mTimeMonitorFederate)._M_string_length = 0;
  (this->mTimeMonitorFederate).field_2._M_local_buf[0] = '\0';
  (this->mTimeMonitorFederateId).gid = -2010000000;
  (this->mTimeMonitorLocalFederateId).gid = -2010000000;
  (this->mTimeMonitorPeriod).internalTimeCode = 0;
  (this->mTimeMonitorLastLogTime).internalTimeCode = -0x7fffffffffffffff;
  (this->mTimeMonitorCurrentTime).internalTimeCode = -0x7fffffffffffffff;
  (this->simTime).super___atomic_float<double>._M_fp = -98763.2;
  (this->mNextTimeBarrier).internalTimeCode = 0x7fffffffffffffff;
  (this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex + 0x10) =
       0;
  (this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->delayTransmitQueue).m_pushLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex + 0x10) =
       0;
  (this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->delayTransmitQueue).m_pullLock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->delayTransmitQueue).pushElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delayTransmitQueue).pushElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->delayTransmitQueue).pushElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->delayTransmitQueue).pullElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->delayTransmitQueue).pullElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->delayTransmitQueue).pullElements.
  super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->delayTransmitQueue).queueEmptyFlag._M_base._M_i = true;
  return;
}

Assistant:

CoreBroker::CoreBroker(bool setAsRootBroker) noexcept:
    _isRoot(setAsRootBroker), isRootc(setAsRootBroker),
    timeoutMon(std::make_unique<TimeoutMonitor>())
{
}